

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlBuildQName(xmlChar *ncname,xmlChar *prefix,xmlChar *memory,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  xmlChar *__dest;
  long lVar5;
  
  if (ncname == (xmlChar *)0x0) {
    __dest = (xmlChar *)0x0;
  }
  else {
    __dest = ncname;
    if (prefix != (xmlChar *)0x0) {
      sVar3 = strlen((char *)ncname);
      sVar4 = strlen((char *)prefix);
      iVar1 = (int)sVar3;
      iVar2 = (int)sVar4;
      if ((memory == (xmlChar *)0x0) || (len < iVar1 + iVar2 + 2)) {
        lVar5 = (ulong)(uint)(iVar1 + iVar2) << 0x20;
        __dest = (xmlChar *)(*xmlMallocAtomic)(lVar5 + 0x200000000 >> 0x20);
        if (__dest == (xmlChar *)0x0) {
          __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building QName");
          return (xmlChar *)0x0;
        }
      }
      else {
        lVar5 = (ulong)(uint)(iVar1 + iVar2) << 0x20;
        __dest = memory;
      }
      memcpy(__dest,prefix,(long)iVar2);
      __dest[iVar2] = ':';
      memcpy(__dest + (iVar2 + 1),ncname,(long)iVar1);
      __dest[lVar5 + 0x100000000 >> 0x20] = '\0';
    }
  }
  return __dest;
}

Assistant:

xmlChar *
xmlBuildQName(const xmlChar *ncname, const xmlChar *prefix,
	      xmlChar *memory, int len) {
    int lenn, lenp;
    xmlChar *ret;

    if (ncname == NULL) return(NULL);
    if (prefix == NULL) return((xmlChar *) ncname);

    lenn = strlen((char *) ncname);
    lenp = strlen((char *) prefix);

    if ((memory == NULL) || (len < lenn + lenp + 2)) {
	ret = (xmlChar *) xmlMallocAtomic(lenn + lenp + 2);
	if (ret == NULL) {
	    xmlTreeErrMemory("building QName");
	    return(NULL);
	}
    } else {
	ret = memory;
    }
    memcpy(&ret[0], prefix, lenp);
    ret[lenp] = ':';
    memcpy(&ret[lenp + 1], ncname, lenn);
    ret[lenn + lenp + 1] = 0;
    return(ret);
}